

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_asof_join.cpp
# Opt level: O2

void __thiscall duckdb::AsOfProbeBuffer::BeginLeftScan(AsOfProbeBuffer *this,hash_t scan_bin)

{
  _Alloc_hider _Var1;
  pointer pGVar2;
  type pPVar3;
  reference pvVar4;
  ulong uVar5;
  reference pvVar6;
  PartitionGlobalHashGroup *pPVar7;
  type pGVar8;
  NotImplementedException *this_00;
  value_type __n;
  ExpressionType local_4a;
  allocator local_49;
  string local_48;
  
  pGVar2 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
           operator->(&(this->op->super_PhysicalComparisonJoin).super_PhysicalJoin.
                       super_CachingPhysicalOperator.super_PhysicalOperator.sink_state);
  pPVar3 = unique_ptr<duckdb::PartitionGlobalSinkState,_std::default_delete<duckdb::PartitionGlobalSinkState>,_true>
           ::operator*((unique_ptr<duckdb::PartitionGlobalSinkState,_std::default_delete<duckdb::PartitionGlobalSinkState>,_true>
                        *)&pGVar2[4].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
                           __data.__list.__next);
  pvVar4 = vector<unsigned_long,_true>::get<true>(&pPVar3->bin_groups,scan_bin);
  __n = *pvVar4;
  this->left_group = __n;
  uVar5 = (long)pGVar2[3].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.
                __list.__prev -
          *(long *)((long)&pGVar2[3].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex
                   + 0x10) >> 3;
  if (scan_bin < uVar5) {
    pvVar4 = vector<unsigned_long,_true>::get<true>
                       ((vector<unsigned_long,_true> *)
                        ((long)&pGVar2[3].super_StateWithBlockableTasks.lock.super___mutex_base.
                                _M_mutex + 0x10),scan_bin);
    uVar5 = *pvVar4;
    __n = this->left_group;
  }
  this->right_group = uVar5;
  if (__n < (ulong)((long)(pPVar3->bin_groups).
                          super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(pPVar3->bin_groups).
                          super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3)) {
    switch(this->op->comparison_type) {
    case COMPARE_LESSTHAN:
      local_4a = COMPARE_GREATERTHAN;
      break;
    case COMPARE_GREATERTHAN:
      local_4a = COMPARE_LESSTHAN;
      break;
    case COMPARE_LESSTHANOREQUALTO:
      local_4a = COMPARE_GREATERTHANOREQUALTO;
      break;
    case COMPARE_GREATERTHANOREQUALTO:
      local_4a = COMPARE_LESSTHANOREQUALTO;
      break;
    default:
      this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_48,"Unsupported comparison type for ASOF join",&local_49);
      NotImplementedException::NotImplementedException(this_00,&local_48);
      __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar6 = vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_true>
             ::get<true>(&pPVar3->hash_groups,__n);
    (this->left_hash).ptr =
         (pvVar6->
         super_unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
         )._M_t.
         super___uniq_ptr_impl<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
         .super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>._M_head_impl;
    pPVar7 = optional_ptr<duckdb::PartitionGlobalHashGroup,_true>::operator->(&this->left_hash);
    pGVar8 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
             ::operator*(&pPVar7->global_sort);
    if ((pGVar8->sorted_blocks).
        super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pGVar8->sorted_blocks).
        super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_49 = (allocator)0x0;
      make_uniq<duckdb::PayloadScanner,duckdb::GlobalSortState&,bool>
                ((duckdb *)&local_48,pGVar8,(bool *)&local_49);
      _Var1._M_p = local_48._M_dataplus._M_p;
      local_48._M_dataplus._M_p = (pointer)0x0;
      ::std::__uniq_ptr_impl<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>::
      reset((__uniq_ptr_impl<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_> *
            )&this->lhs_scanner,(pointer)_Var1._M_p);
      ::std::unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>::
      ~unique_ptr((unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>
                   *)&local_48);
      make_uniq<duckdb::SBIterator,duckdb::GlobalSortState&,duckdb::ExpressionType&>
                ((duckdb *)&local_48,pGVar8,&local_4a);
      _Var1._M_p = local_48._M_dataplus._M_p;
      local_48._M_dataplus._M_p = (pointer)0x0;
      ::std::__uniq_ptr_impl<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_>::reset
                ((__uniq_ptr_impl<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_> *)
                 &this->left_itr,(pointer)_Var1._M_p);
      ::std::unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_>::~unique_ptr
                ((unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_> *)
                 &local_48);
      if (this->right_group <
          (ulong)((long)pGVar2[3].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
                        __data.__list.__prev -
                  *(long *)((long)&pGVar2[3].super_StateWithBlockableTasks.lock.super___mutex_base.
                                   _M_mutex + 0x10) >> 3)) {
        pvVar6 = vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_true>
                 ::get<true>((vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_true>
                              *)(pGVar2 + 3),this->right_group);
        (this->right_hash).ptr =
             (pvVar6->
             super_unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
             .super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>._M_head_impl;
        (this->right_outer).ptr =
             (OuterJoinMarker *)
             (this->right_group * 0x18 +
             pGVar2[4].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__align);
        pPVar7 = optional_ptr<duckdb::PartitionGlobalHashGroup,_true>::operator->(&this->right_hash)
        ;
        pGVar8 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                 ::operator*(&pPVar7->global_sort);
        make_uniq<duckdb::SBIterator,duckdb::GlobalSortState&,duckdb::ExpressionType&>
                  ((duckdb *)&local_48,pGVar8,&local_4a);
        _Var1._M_p = local_48._M_dataplus._M_p;
        local_48._M_dataplus._M_p = (pointer)0x0;
        ::std::__uniq_ptr_impl<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_>::reset
                  ((__uniq_ptr_impl<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_> *)
                   &this->right_itr,(pointer)_Var1._M_p);
        ::std::unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_>::~unique_ptr
                  ((unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_> *)
                   &local_48);
        local_49 = (allocator)0x0;
        make_uniq<duckdb::PayloadScanner,duckdb::GlobalSortState&,bool>
                  ((duckdb *)&local_48,pGVar8,(bool *)&local_49);
        _Var1._M_p = local_48._M_dataplus._M_p;
        local_48._M_dataplus._M_p = (pointer)0x0;
        ::std::__uniq_ptr_impl<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>
        ::reset((__uniq_ptr_impl<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>
                 *)&this->rhs_scanner,(pointer)_Var1._M_p);
        ::std::unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>::
        ~unique_ptr((unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>
                     *)&local_48);
      }
    }
  }
  return;
}

Assistant:

void AsOfProbeBuffer::BeginLeftScan(hash_t scan_bin) {
	auto &gsink = op.sink_state->Cast<AsOfGlobalSinkState>();

	auto &lhs_sink = *gsink.lhs_sink;
	left_group = lhs_sink.bin_groups[scan_bin];

	//	Always set right_group too for memory management
	auto &rhs_sink = gsink.rhs_sink;
	if (scan_bin < rhs_sink.bin_groups.size()) {
		right_group = rhs_sink.bin_groups[scan_bin];
	} else {
		right_group = rhs_sink.bin_groups.size();
	}

	if (left_group >= lhs_sink.bin_groups.size()) {
		return;
	}

	auto iterator_comp = ExpressionType::INVALID;
	switch (op.comparison_type) {
	case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
		iterator_comp = ExpressionType::COMPARE_LESSTHANOREQUALTO;
		break;
	case ExpressionType::COMPARE_GREATERTHAN:
		iterator_comp = ExpressionType::COMPARE_LESSTHAN;
		break;
	case ExpressionType::COMPARE_LESSTHANOREQUALTO:
		iterator_comp = ExpressionType::COMPARE_GREATERTHANOREQUALTO;
		break;
	case ExpressionType::COMPARE_LESSTHAN:
		iterator_comp = ExpressionType::COMPARE_GREATERTHAN;
		break;
	default:
		throw NotImplementedException("Unsupported comparison type for ASOF join");
	}

	left_hash = lhs_sink.hash_groups[left_group].get();
	auto &left_sort = *(left_hash->global_sort);
	if (left_sort.sorted_blocks.empty()) {
		return;
	}
	lhs_scanner = make_uniq<PayloadScanner>(left_sort, false);
	left_itr = make_uniq<SBIterator>(left_sort, iterator_comp);

	// We are only probing the corresponding right side bin, which may be empty
	// If they are empty, we leave the iterator as null so we can emit left matches
	if (right_group < rhs_sink.bin_groups.size()) {
		right_hash = rhs_sink.hash_groups[right_group].get();
		right_outer = gsink.right_outers.data() + right_group;
		auto &right_sort = *(right_hash->global_sort);
		right_itr = make_uniq<SBIterator>(right_sort, iterator_comp);
		rhs_scanner = make_uniq<PayloadScanner>(right_sort, false);
	}
}